

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# skip.hpp
# Opt level: O1

void toml::detail::skip_inline_table_like<toml::type_config>
               (location *loc,context<toml::type_config> *ctx)

{
  element_type *peVar1;
  size_t sVar2;
  long lVar3;
  ulong uVar4;
  ulong uVar5;
  size_t sVar6;
  bool bVar7;
  location checkpoint;
  sequence local_188;
  sequence local_168;
  location local_148;
  region local_100;
  region local_98;
  
  peVar1 = (loc->source_).
           super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  uVar5 = loc->location_;
  lVar3 = (long)(peVar1->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                super__Vector_impl_data._M_start;
  uVar4 = (long)(peVar1->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                super__Vector_impl_data._M_finish - lVar3;
  if (uVar5 + 1 < uVar4) {
    if (*(char *)(lVar3 + uVar5) == '\n') {
      loc->line_number_ = loc->line_number_ + 1;
      sVar2 = 1;
    }
    else {
      sVar2 = loc->column_number_ + 1;
    }
    loc->column_number_ = sVar2;
    uVar4 = uVar5 + 1;
  }
  else if (uVar4 != uVar5) {
    sVar2 = loc->line_number_;
    sVar6 = loc->column_number_;
    do {
      if (*(char *)(lVar3 + uVar5) == '\n') {
        sVar2 = sVar2 + 1;
        loc->line_number_ = sVar2;
        sVar6 = 1;
      }
      else {
        sVar6 = sVar6 + 1;
      }
      loc->column_number_ = sVar6;
      uVar5 = uVar5 + 1;
    } while (uVar4 != uVar5);
  }
  loc->location_ = uVar4;
  peVar1 = (loc->source_).
           super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  lVar3 = (long)(peVar1->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                super__Vector_impl_data._M_start;
  uVar5 = (long)(peVar1->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                super__Vector_impl_data._M_finish - lVar3;
  if (uVar5 <= uVar4) {
    return;
  }
  do {
    if ((*(char *)(lVar3 + uVar4) == '\n') &&
       ((ctx->toml_spec_).v1_1_0_allow_newlines_in_inline_tables != true)) {
      return;
    }
    if (uVar4 < uVar5) {
      if (*(char *)(lVar3 + uVar4) != '\"') {
        if (uVar4 < uVar5) {
          if (*(char *)(lVar3 + uVar4) == '\'') goto LAB_003dd676;
          if (uVar4 < uVar5) {
            if (*(char *)(lVar3 + uVar4) == '#') {
              skip_comment_block<toml::type_config>(loc,ctx);
              if ((ctx->toml_spec_).v1_1_0_allow_newlines_in_inline_tables == false) {
                return;
              }
              goto LAB_003dd866;
            }
            if (uVar4 < uVar5) {
              if (*(char *)(lVar3 + uVar4) == '[') {
                location::location(&local_148,loc);
                syntax::std_table(&local_188,&ctx->toml_spec_);
                sequence::scan(&local_100,&local_188,loc);
                bVar7 = true;
                if (local_100.source_.
                    super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
                    ._M_ptr == (element_type *)0x0) {
                  syntax::array_table(&local_168,&ctx->toml_spec_);
                  sequence::scan(&local_98,&local_168,loc);
                  bVar7 = local_98.source_.
                          super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
                          ._M_ptr != (element_type *)0x0;
                  region::~region(&local_98);
                  std::
                  vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>
                  ::~vector(&local_168.others_);
                }
                region::~region(&local_100);
                std::
                vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>
                ::~vector(&local_188.others_);
                if (bVar7) {
                  (loc->source_).
                  super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_ptr = local_148.source_.
                            super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
                            ._M_ptr;
                  CLI::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                             &(loc->source_).
                              super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
                              ._M_refcount,
                             (__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                             &local_148.source_.
                              super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
                              ._M_refcount);
                  CLI::std::__cxx11::
                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
                            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &loc->source_name_,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &local_148.source_name_);
                  loc->column_number_ = local_148.column_number_;
                  loc->location_ = local_148.location_;
                  loc->line_number_ = local_148.line_number_;
                }
                else {
                  skip_array_like<toml::type_config>(loc,ctx);
                }
                location::~location(&local_148);
                if (bVar7) {
                  return;
                }
                goto LAB_003dd866;
              }
              if (uVar4 < uVar5) {
                if (*(char *)(lVar3 + uVar4) == '{') {
                  skip_inline_table_like<toml::type_config>(loc,ctx);
                  goto LAB_003dd866;
                }
                if ((uVar4 < uVar5) && (*(char *)(lVar3 + uVar4) == '}')) {
                  return;
                }
              }
            }
          }
        }
        goto LAB_003dd808;
      }
LAB_003dd676:
      skip_string_like<toml::type_config>(loc,ctx);
    }
    else {
LAB_003dd808:
      if (uVar4 + 1 < uVar5) {
        if (*(char *)(lVar3 + uVar4) == '\n') {
          loc->line_number_ = loc->line_number_ + 1;
          sVar2 = 1;
        }
        else {
          sVar2 = loc->column_number_ + 1;
        }
        loc->column_number_ = sVar2;
        uVar5 = uVar4 + 1;
      }
      else if (uVar5 != uVar4) {
        sVar2 = loc->line_number_;
        sVar6 = loc->column_number_;
        do {
          if (*(char *)(lVar3 + uVar4) == '\n') {
            sVar2 = sVar2 + 1;
            loc->line_number_ = sVar2;
            sVar6 = 1;
          }
          else {
            sVar6 = sVar6 + 1;
          }
          loc->column_number_ = sVar6;
          uVar4 = uVar4 + 1;
        } while (uVar5 != uVar4);
      }
      loc->location_ = uVar5;
    }
LAB_003dd866:
    peVar1 = (loc->source_).
             super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr;
    uVar4 = loc->location_;
    lVar3 = (long)(peVar1->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                  _M_impl.super__Vector_impl_data._M_start;
    uVar5 = (long)(peVar1->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                  _M_impl.super__Vector_impl_data._M_finish - lVar3;
    if (uVar5 <= uVar4) {
      return;
    }
  } while( true );
}

Assistant:

void skip_inline_table_like(location& loc, const context<TC>& ctx)
{
    assert(loc.current() == '{');
    loc.advance();

    const auto& spec = ctx.toml_spec();

    while( ! loc.eof())
    {
        if(loc.current() == '\n' && ! spec.v1_1_0_allow_newlines_in_inline_tables)
        {
            break; // missing closing `}`.
        }
        else if(loc.current() == '\"' || loc.current() == '\'')
        {
            skip_string_like(loc, ctx);
        }
        else if(loc.current() == '#')
        {
            skip_comment_block(loc, ctx);
            if( ! spec.v1_1_0_allow_newlines_in_inline_tables)
            {
                // comment must end with newline.
                break; // missing closing `}`.
            }
        }
        else if(loc.current() == '[')
        {
            const auto checkpoint = loc;
            if(syntax::std_table(spec).scan(loc).is_ok() ||
               syntax::array_table(spec).scan(loc).is_ok())
            {
                loc = checkpoint;
                break; // missing closing `}`.
            }
            // if it is not a table-definition, then it is an array.
            skip_array_like(loc, ctx);
        }
        else if(loc.current() == '{')
        {
            skip_inline_table_like(loc, ctx);
        }
        else if(loc.current() == '}')
        {
            // closing brace found. guessing the error is inside the table.
            break;
        }
        else
        {
            // skip otherwise.
            loc.advance();
        }
    }
    return ;
}